

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerStAtomicsWasm(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Opnd *addrOpnd;
  Opnd *src1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  Instr *insertBeforeInstr;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2635,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_00552f8f;
    *puVar4 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2636,"(instr)","instr");
    if (!bVar3) goto LAB_00552f8f;
    *puVar4 = 0;
  }
  if (instr->m_opcode != StAtomicWasm) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2637,"(instr->m_opcode == Js::OpCode::StAtomicWasm)",
                       "instr->m_opcode == Js::OpCode::StAtomicWasm");
    if (!bVar3) goto LAB_00552f8f;
    *puVar4 = 0;
  }
  pIVar1 = instr->m_prev;
  addrOpnd = instr->m_dst;
  src1 = instr->m_src1;
  bVar3 = IRType_IsNativeInt(addrOpnd->m_type);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x263e,"(IRType_IsNativeInt(dst->GetType()))",
                       "IRType_IsNativeInt(dst->GetType())");
    if (!bVar3) {
LAB_00552f8f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  insertBeforeInstr = LowerWasmArrayBoundsCheck(this,instr,addrOpnd);
  LowererMD::LowerAtomicStore(&this->m_lowererMD,addrOpnd,src1,insertBeforeInstr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerStAtomicsWasm(IR::Instr* instr)
{
#ifdef ENABLE_WASM
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StAtomicWasm);

    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();

    Assert(IRType_IsNativeInt(dst->GetType()));

    IR::Instr * done = LowerWasmArrayBoundsCheck(instr, dst);
    m_lowererMD.LowerAtomicStore(dst, src1, done);

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}